

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O2

compressed_lower_distance_matrix *
read_lower_distance_matrix
          (compressed_lower_distance_matrix *__return_storage_ptr__,istream *input_stream)

{
  istream *piVar1;
  value_t value;
  vector<float,_std::allocator<float>_> distances;
  value_type_conflict1 local_3c;
  _Vector_base<float,_std::allocator<float>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    piVar1 = std::istream::_M_extract<float>((float *)input_stream);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)&local_38,&local_3c);
    std::istream::ignore();
  }
  compressed_distance_matrix<(compressed_matrix_layout)0>::compressed_distance_matrix
            (__return_storage_ptr__,(vector<float,_std::allocator<float>_> *)&local_38);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

compressed_lower_distance_matrix read_lower_distance_matrix(std::istream& input_stream) {
	std::vector<value_t> distances;
	value_t value;
	while (input_stream >> value) {
		distances.push_back(value);
		input_stream.ignore();
	}

	return compressed_lower_distance_matrix(std::move(distances));
}